

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_SelectDataSet_canDetermineSpecificationForSelectDataSet_Test::
~QueryTests_SelectDataSet_canDetermineSpecificationForSelectDataSet_Test
          (QueryTests_SelectDataSet_canDetermineSpecificationForSelectDataSet_Test *this)

{
  QueryTests_SelectDataSet_canDetermineSpecificationForSelectDataSet_Test *this_local;
  
  ~QueryTests_SelectDataSet_canDetermineSpecificationForSelectDataSet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests_SelectDataSet,canDetermineSpecificationForSelectDataSet)
{
  database::Query query_select_dataset = "select employee_id,employee_name from company.employee";
  ASSERT_TRUE(query_select_dataset.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset.containerName() == "employee");
  std::vector<std::string> expected_dataset = {"employee_id","employee_name"};
  ASSERT_TRUE(query_select_dataset.dataset() == expected_dataset);
  database::api_filter_type expected_filter = {};
  ASSERT_TRUE(query_select_dataset.filter() == expected_filter);
}